

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_block.cpp
# Opt level: O1

void __thiscall spvtools::opt::BasicBlock::KillAllInsts(BasicBlock *this,bool killLabel)

{
  char cVar1;
  Instruction *pIVar2;
  Instruction *pIVar3;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_70;
  _Any_data *local_68;
  undefined8 uStack_60;
  code *local_58;
  code *pcStack_50;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  local_68 = &local_48;
  local_48._8_8_ = 0;
  local_48._1_7_ = 0;
  local_48._M_pod_data[0] = killLabel;
  pcStack_30 = std::
               _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.cpp:98:15)>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.cpp:98:15)>
             ::_M_manager;
  uStack_60 = 0;
  pcStack_50 = std::
               _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h:295:7)>
               ::_M_invoke;
  local_58 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h:295:7)>
             ::_M_manager;
  pIVar3 = (this->label_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if (pIVar3 != (Instruction *)0x0) {
    local_70._M_head_impl = pIVar3;
    std::
    _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.cpp:98:15)>
    ::_M_invoke(local_68,&local_70._M_head_impl);
  }
  pIVar3 = (this->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  if ((pIVar3 != (Instruction *)0x0) &&
     ((pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
    do {
      if (pIVar3 == (Instruction *)0x0) break;
      pIVar2 = (pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      local_70._M_head_impl = pIVar3;
      if (local_58 == (code *)0x0) {
        std::__throw_bad_function_call();
      }
      if ((pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false) {
        pIVar2 = (Instruction *)0x0;
      }
      cVar1 = (*pcStack_50)(&local_68,&local_70);
      pIVar3 = pIVar2;
    } while (cVar1 != '\0');
  }
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,3);
  }
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,3);
  }
  return;
}

Assistant:

void BasicBlock::KillAllInsts(bool killLabel) {
  ForEachInst([killLabel](Instruction* ip) {
    if (killLabel || ip->opcode() != spv::Op::OpLabel) {
      ip->context()->KillInst(ip);
    }
  });
}